

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgproc.cpp
# Opt level: O1

void copyChannel(Image *src,Image *dest,int channel)

{
  undefined8 in_RAX;
  domain_error *this;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uStack_18;
  
  if ((src == (Image *)0x0) || (dest == (Image *)0x0)) {
    __assert_fail("(src != nullptr) && (dest != nullptr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/acstud[P]lab2/src/baseline/imgproc.cpp"
                  ,0xb5,"void copyChannel(const Image *, Image *, int)");
  }
  if ((src->width == dest->width) && (src->height == dest->height)) {
    if ((uint)channel < 4) {
      if (src->height != 0) {
        uVar1 = 0;
        uStack_18 = in_RAX;
        do {
          uVar3 = src->width;
          if (uVar3 != 0) {
            uVar2 = 0;
            do {
              if (src->height <= uVar1) {
                __assert_fail("(x < width) && (y < height)",
                              "/workspace/llm4binary/github/license_c_cmakelists/acstud[P]lab2/src/baseline/../utils/Image.hpp"
                              ,0x33,"Pixel Image::operator()(int, int) const");
              }
              uStack_18 = CONCAT44(*(undefined4 *)src->pixels[uVar3 * uVar1 + uVar2].colors,
                                   (undefined4)uStack_18);
              if ((dest->width <= uVar2) || (dest->height <= uVar1)) {
                __assert_fail("(x < width) && (y < height)",
                              "/workspace/llm4binary/github/license_c_cmakelists/acstud[P]lab2/src/baseline/../utils/Image.hpp"
                              ,0x3e,"Pixel &Image::operator()(int, int)");
              }
              dest->pixels[dest->width * uVar1 + uVar2].colors[(uint)channel] =
                   *(uchar *)((long)&uStack_18 + (ulong)(uint)channel + 4);
              uVar2 = uVar2 + 1;
              uVar3 = src->width;
            } while (uVar2 < uVar3);
          }
          uVar1 = uVar1 + 1;
        } while (uVar1 < src->height);
      }
      return;
    }
    this = (domain_error *)__cxa_allocate_exception(0x10);
    std::domain_error::domain_error(this,"Color channel must be 0,1,2 or 3.");
  }
  else {
    this = (domain_error *)__cxa_allocate_exception(0x10);
    std::domain_error::domain_error
              (this,"Source and destination image are not of equal dimensions.");
  }
  __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

void copyChannel(const Image *src, Image *dest, int channel) {
  // Check arguments
  assert((src != nullptr) && (dest != nullptr));
  checkDimensionsEqualOrThrow(src, dest);
  checkValidColorChannelOrThrow(channel);

  // For every pixel
  for (int y = 0; y < src->height; y++) {
    for (int x = 0; x < src->width; x++) {
      // Just copy the value.
      dest->pixel(x, y).colors[channel] = src->pixel(x, y).colors[channel];
    }
  }
}